

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

void __thiscall helics::FederateState::setOptionFlag(FederateState *this,int optionFlag,bool value)

{
  TimeCoordinator *this_00;
  
  if (0x5f < optionFlag) {
    if (optionFlag < 0x192) {
      if (optionFlag < 0x6e) {
        if (optionFlag == 0x60) {
          this->mLocalProfileCapture = value;
          return;
        }
        if (optionFlag == 0x67) {
          if ((this->state)._M_i != CREATED) {
            return;
          }
          this->mCallbackBased = value;
          return;
        }
        if (optionFlag == 0x6d) {
LAB_002bf51f:
          this->mAllowRemoteControl = value;
          return;
        }
      }
      else {
        if (optionFlag == 0x6e) {
          value = !value;
          goto LAB_002bf51f;
        }
        if (optionFlag == 0x114) {
          LogBuffer::enable(&((this->mLogManager)._M_t.
                              super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>
                              .super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl)->
                             mLogBuffer,value);
          return;
        }
        if (optionFlag == 0x18d) {
          if (value) {
            LOCK();
            (this->interfaceFlags).super___atomic_base<unsigned_short>._M_i =
                 (this->interfaceFlags).super___atomic_base<unsigned_short>._M_i | 4;
            UNLOCK();
            return;
          }
          LOCK();
          (this->interfaceFlags).super___atomic_base<unsigned_short>._M_i =
               (this->interfaceFlags).super___atomic_base<unsigned_short>._M_i & 0xfffb;
          UNLOCK();
          return;
        }
      }
    }
    else if (optionFlag < 0x19e) {
      if (optionFlag == 0x192) {
        if (value) {
          LOCK();
          (this->interfaceFlags).super___atomic_base<unsigned_short>._M_i =
               (this->interfaceFlags).super___atomic_base<unsigned_short>._M_i | 0x100;
          UNLOCK();
          return;
        }
        LOCK();
        (this->interfaceFlags).super___atomic_base<unsigned_short>._M_i =
             (this->interfaceFlags).super___atomic_base<unsigned_short>._M_i & 0xfeff;
        UNLOCK();
        return;
      }
      if (optionFlag == 0x19b) {
        return;
      }
      if (optionFlag == 0x19c) {
        if (value) {
          LOCK();
          (this->interfaceFlags).super___atomic_base<unsigned_short>._M_i =
               (this->interfaceFlags).super___atomic_base<unsigned_short>._M_i | 0x80;
          UNLOCK();
          return;
        }
        LOCK();
        (this->interfaceFlags).super___atomic_base<unsigned_short>._M_i =
             (this->interfaceFlags).super___atomic_base<unsigned_short>._M_i & 0xff7f;
        UNLOCK();
        return;
      }
    }
    else if (optionFlag < 0x1c4) {
      if (optionFlag == 0x19e) {
        this->strict_input_type_checking = value;
        return;
      }
      if (optionFlag == 0x1bf) {
        this->ignore_unit_mismatch = value;
        return;
      }
    }
    else {
      if (optionFlag == 0x1c6) goto switchD_002bf300_caseD_8;
      if (optionFlag == 0x1c4) goto switchD_002bf300_caseD_6;
    }
    goto switchD_002bf300_caseD_1;
  }
  if (0x1c < optionFlag) {
    if (optionFlag < 0x43) {
      if ((optionFlag == 0x1d) || (optionFlag == 0x1f)) {
        this->mSlowResponding = value;
        return;
      }
      if (optionFlag == 0x26) {
        if ((this->state)._M_i != CREATED) {
          return;
        }
        this->reentrant = value;
        return;
      }
    }
    else if (optionFlag < 0x5d) {
      if (optionFlag == 0x43) {
        this->ignore_time_mismatch_warnings = value;
        return;
      }
      if (optionFlag == 0x48) {
        this->terminate_on_error = value;
        return;
      }
    }
    else {
      if (optionFlag == 0x5d) {
        if ((value) && (this->mProfilerActive == false)) {
          generateProfilingMarker(this);
        }
        this->mProfilerActive = value;
        return;
      }
      if (optionFlag == 0x5f) {
        if (!value) {
          return;
        }
        if (this->mProfilerActive != true) {
          return;
        }
        generateProfilingMarker(this);
        return;
      }
    }
    goto switchD_002bf300_caseD_1;
  }
  switch(optionFlag) {
  case 0:
    if (((this->state)._M_i == CREATED) && (this->observer = value, value)) {
      this->mSourceOnly = false;
    }
    break;
  case 4:
    if (((this->state)._M_i == CREATED) && (this->mSourceOnly = value, value)) {
      this->observer = false;
    }
    break;
  case 6:
switchD_002bf300_caseD_6:
    this->only_transmit_on_change = value;
    break;
  case 8:
switchD_002bf300_caseD_8:
    InterfaceInfo::setChangeUpdateFlag(&this->interfaceInformation,value);
    return;
  case 10:
    this->wait_for_current_time = value;
    this_00 = (this->timeCoord)._M_t.
              super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
              ._M_t.
              super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
              .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
    optionFlag = 10;
    goto LAB_002bf4c2;
  default:
    if (optionFlag == 0x10) {
      if (!value) {
        this->realtime = false;
        return;
      }
      if (INITIALIZING < (this->state)._M_i) {
        return;
      }
      this->realtime = true;
      return;
    }
  case 1:
  case 2:
  case 3:
  case 5:
  case 7:
  case 9:
switchD_002bf300_caseD_1:
    this_00 = (this->timeCoord)._M_t.
              super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
              ._M_t.
              super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
              .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
LAB_002bf4c2:
    TimeCoordinator::setOptionFlag(this_00,optionFlag,value);
    return;
  }
  return;
}

Assistant:

void FederateState::setOptionFlag(int optionFlag, bool value)
{
    switch (optionFlag) {
        case defs::Flags::ONLY_TRANSMIT_ON_CHANGE:
        case defs::Options::HANDLE_ONLY_TRANSMIT_ON_CHANGE:
            only_transmit_on_change = value;
            break;
        case defs::Flags::ONLY_UPDATE_ON_CHANGE:
        case defs::Options::HANDLE_ONLY_UPDATE_ON_CHANGE:
            interfaceInformation.setChangeUpdateFlag(value);
            break;
        case defs::Flags::STRICT_INPUT_TYPE_CHECKING:
            strict_input_type_checking = value;
            break;
        case defs::Flags::IGNORE_INPUT_UNIT_MISMATCH:
            ignore_unit_mismatch = value;
            break;
        case defs::Flags::SLOW_RESPONDING:
        case defs::Flags::DEBUGGING:
            mSlowResponding = value;
            break;
        case defs::Flags::PROFILING:
            if (value && !mProfilerActive) {
                generateProfilingMarker();
            }
            mProfilerActive = value;
            break;
        case defs::Flags::ALLOW_REMOTE_CONTROL:
            mAllowRemoteControl = value;
            break;
        case defs::Flags::DISABLE_REMOTE_CONTROL:
            mAllowRemoteControl = !value;
            break;
        case defs::Flags::PROFILING_MARKER:
            if (value && mProfilerActive) {
                generateProfilingMarker();
            }
            break;
        case defs::Flags::LOCAL_PROFILING_CAPTURE:
            mLocalProfileCapture = value;
            break;
        case defs::Flags::TERMINATE_ON_ERROR:
            terminate_on_error = value;
            break;
        case defs::Flags::REALTIME:
            if (value) {
                if (state < FederateStates::EXECUTING) {
                    realtime = true;
                }
            } else {
                realtime = false;
            }

            break;
        case defs::Flags::SOURCE_ONLY:
            if (state == FederateStates::CREATED) {
                mSourceOnly = value;
                if (value) {
                    observer = false;
                }
            }
            break;
        case defs::Flags::OBSERVER:
            if (state == FederateStates::CREATED) {
                observer = value;
                if (value) {
                    mSourceOnly = false;
                }
            }
            break;
        case defs::Flags::REENTRANT:
            if (state == FederateStates::CREATED) {
                reentrant = value;
            }
            break;
        case defs::Flags::CALLBACK_FEDERATE:
            if (state == FederateStates::CREATED) {
                mCallbackBased = value;
            }
            break;
        case defs::Flags::IGNORE_TIME_MISMATCH_WARNINGS:
            ignore_time_mismatch_warnings = value;
            break;
        case defs::Flags::WAIT_FOR_CURRENT_TIME_UPDATE:
            // this flag is needed in both locations
            wait_for_current_time = value;
            timeCoord->setOptionFlag(optionFlag, value);
            break;
        case defs::Options::BUFFER_DATA:
            break;
        case defs::Options::RECONNECTABLE:
            if (value) {
                interfaceFlags |= make_flags(reconnectable_flag);
            } else {
                interfaceFlags &= ~(make_flags(reconnectable_flag));
            }
            break;
        case defs::Flags::CONNECTIONS_REQUIRED:
            if (value) {
                interfaceFlags |= make_flags(required_flag);
            } else {
                interfaceFlags &= ~(make_flags(required_flag));
            }
            break;
        case defs::Flags::CONNECTIONS_OPTIONAL:
            if (value) {
                interfaceFlags |= make_flags(optional_flag);
            } else {
                interfaceFlags &= ~(make_flags(optional_flag));
            }
            break;
        case defs::Properties::LOG_BUFFER:
            mLogManager->getLogBuffer().enable(value);
            break;
        default:
            timeCoord->setOptionFlag(optionFlag, value);
            break;
    }
}